

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

bool WindowedKeyTest<Blob<32>,unsigned_long>
               (hashfunc<unsigned_long> hash,int windowbits,bool testCollision,bool testDistribution
               ,bool drawDiagram)

{
  uint uVar1;
  bool bVar2;
  reference pvVar3;
  byte in_CL;
  byte in_DL;
  uint in_ESI;
  byte in_R8B;
  double dVar4;
  int i;
  Blob<32> key;
  int minbit;
  int j;
  int testcount;
  bool result;
  vector<unsigned_long,_std::allocator<unsigned_long>_> hashes;
  int keycount;
  int keybits;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  pfHash in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa4;
  Blob<32> in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  int x;
  Blob<32> in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  uint local_48;
  bool local_3d;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_30;
  uint local_18;
  undefined4 local_14;
  byte local_f;
  byte local_e;
  byte local_d;
  uint local_c;
  hashfunc local_8 [8];
  
  local_d = in_DL & 1;
  local_e = in_CL & 1;
  local_f = in_R8B & 1;
  local_14 = 0x20;
  local_18 = 1 << ((byte)in_ESI & 0x1f);
  local_c = in_ESI;
  while( true ) {
    dVar4 = EstimateNbCollisions(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0);
    uVar1 = in_stack_ffffffffffffffa4 & 0xffffff;
    if (dVar4 < 0.5) {
      uVar1 = CONCAT13((int)local_c < 0x19,(int3)in_stack_ffffffffffffffa4);
    }
    in_stack_ffffffffffffffa4 = uVar1;
    if (((char)(in_stack_ffffffffffffffa4 >> 0x18) == '\0') ||
       (dVar4 = log2((double)(int)local_18 * 2.0), (int)dVar4 < 0)) break;
    local_18 = local_18 << 1;
    dVar4 = log2((double)(int)local_18 * 1.0);
    local_c = (uint)dVar4;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x14de56);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0.bytes),
             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8.bytes));
  local_3d = true;
  printf("Keyset \'Window\' - %3d-bit key, %3d-bit window - %d tests, %d keys per test\n",0x20,
         (ulong)local_c,0x20,(ulong)local_18);
  for (local_48 = 0; (int)local_48 < 0x21; local_48 = local_48 + 1) {
    Blob<32>::Blob((Blob<32> *)&stack0xffffffffffffffb0);
    for (x = 0; x < (int)local_18; x = x + 1) {
      Blob<32>::Blob((Blob<32> *)&stack0xffffffffffffffa8,x);
      Blob<32>::operator=((Blob<32> *)&stack0xffffffffffffffb0,(Blob<32> *)&stack0xffffffffffffffa8)
      ;
      lrot(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
      in_stack_ffffffffffffff90 = hashfunc::operator_cast_to_function_pointer(local_8);
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&local_30,(long)x);
      (*in_stack_ffffffffffffff90)(&stack0xffffffffffffffb0,4,0,pvVar3);
    }
    printf("Window at %3d - ",(ulong)local_48);
    bVar2 = TestHashList<unsigned_long>
                      (_keycount,
                       hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_,
                       hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_,
                       hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage._5_1_,
                       hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage._4_1_,
                       hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage._3_1_);
    in_stack_ffffffffffffff8c = CONCAT13(bVar2,(int3)in_stack_ffffffffffffff8c);
    local_3d = (local_3d & bVar2) != 0;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  return (bool)(local_3d & 1);
}

Assistant:

bool WindowedKeyTest ( hashfunc<hashtype> hash, int windowbits,
                       bool testCollision, bool testDistribution, bool drawDiagram )
{
  const int keybits = sizeof(keytype) * 8;
  // calc keycount to expect min. 0.5 collisions: EstimateNbCollisions, except for 64++bit.
  // there limit to 2^25 = 33554432 keys
  int keycount = 1 << windowbits;
  while (EstimateNbCollisions(keycount, sizeof(hashtype) * 8) < 0.5 && windowbits < 25) {
    if ((int)log2(2.0 * keycount) < 0) // overflow
      break;
    keycount *= 2;
    windowbits = (int)log2(1.0 * keycount);
    //printf (" enlarge windowbits to %d (%d keys)\n", windowbits, keycount);
    //fflush (NULL);
  }

  std::vector<hashtype> hashes;
  hashes.resize(keycount);

  bool result = true;
  int testcount = keybits;

  printf("Keyset 'Window' - %3d-bit key, %3d-bit window - %d tests, %d keys per test\n",
         keybits,windowbits,testcount,keycount);

  for(int j = 0; j <= testcount; j++)
  {
    int minbit = j;
    keytype key;

    for(int i = 0; i < keycount; i++)
    {
      key = i;
      //key = key << minbit;
      lrot(&key,sizeof(keytype),minbit);
      hash(&key,sizeof(keytype),0,&hashes[i]);
    }

    printf("Window at %3d - ",j);
    result &= TestHashList(hashes, drawDiagram, testCollision, testDistribution,
                           /* do not test high/low bits (to not clobber the screen) */
                           false, false);
    //printf("\n");
  }

  return result;
}